

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O2

int lj_cf_buffer_method_set(lua_State *L)

{
  TValue *pTVar1;
  CTState *cts;
  undefined8 *puVar2;
  char *pcVar3;
  MSize MVar4;
  SBufExt *pSVar5;
  GCstr *pGVar6;
  ulong uVar7;
  anon_union_8_2_d9f1b0d6_for_SBufExt_4 v;
  char *p;
  
  pSVar5 = buffer_tobuf(L);
  pTVar1 = L->base;
  if (pTVar1[1].field_4.it >> 0xf == 0x1fff5) {
    cts = *(CTState **)((L->glref).ptr64 + 0x180);
    cts->L = L;
    lj_cconv_ct_tv(cts,cts->tab + 0x12,(uint8_t *)&p,pTVar1 + 1,0x200);
    MVar4 = lj_lib_checkintrange(L,3,0,0x7fffff00);
  }
  else {
    pGVar6 = lj_lib_checkstrx(L,2);
    p = (char *)(pGVar6 + 1);
    MVar4 = pGVar6->len;
  }
  if (((pSVar5->L).ptr64 & 6) == 0) {
    puVar2 = (undefined8 *)(L->glref).ptr64;
    pcVar3 = pSVar5->b;
    uVar7 = (ulong)(uint)(*(int *)&pSVar5->e - (int)pcVar3);
    puVar2[2] = puVar2[2] - uVar7;
    (*(code *)*puVar2)(puVar2[1],pcVar3,uVar7,0);
  }
  pSVar5->field_4 = (anon_union_8_2_d9f1b0d6_for_SBufExt_4)0x0;
  (pSVar5->L).ptr64 = (uint64_t)((long)&(L->nextgc).gcptr64 + 3);
  pSVar5->b = p;
  pSVar5->r = p;
  pSVar5->e = p + MVar4;
  pSVar5->w = p + MVar4;
  v = (anon_union_8_2_d9f1b0d6_for_SBufExt_4)(L->base[1].u64 & 0x7fffffffffff);
  pSVar5->field_4 = v;
  if (((*(byte *)((long)v + 8) & 3) != 0) && (((ulong)pSVar5[-1].field_4 & 4) != 0)) {
    lj_gc_barrierf((global_State *)(L->glref).ptr64,(GCobj *)&pSVar5[-1].L,(GCobj *)v);
  }
  L->top = L->base + 1;
  return 1;
}

Assistant:

LJLIB_CF(buffer_method_set)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobuf(L);
  GCobj *ref;
  const char *p;
  MSize len;
#if LJ_HASFFI
  if (tviscdata(L->base+1)) {
    CTState *cts = ctype_cts(L);
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_P_CVOID), (uint8_t *)&p,
		   L->base+1, CCF_ARG(2));
    len = (MSize)lj_lib_checkintrange(L, 3, 0, LJ_MAX_BUF);
  } else
#endif
  {
    GCstr *str = lj_lib_checkstrx(L, 2);
    p = strdata(str);
    len = str->len;
  }
  lj_bufx_free(L, sbx);
  lj_bufx_set_cow(L, sbx, p, len);
  ref = gcV(L->base+1);
  setgcref(sbx->cowref, ref);
  lj_gc_objbarrier(L, buffer_toudata(sbx), ref);
  L->top = L->base+1;  /* Chain buffer object. */
  return 1;
}